

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsLifetimeTests.cpp
# Opt level: O0

GLint deqp::gls::LifetimeTests::details::getInteger(ContextWrapper *gl,GLenum queryParam)

{
  GLenum err;
  deBool dVar1;
  TestLog *this;
  MessageBuilder *pMVar2;
  double __x;
  MessageBuilder local_198;
  GLint local_18;
  GLenum local_14;
  GLint ret;
  GLenum queryParam_local;
  ContextWrapper *gl_local;
  
  local_18 = 0;
  local_14 = queryParam;
  _ret = gl;
  do {
    glu::CallLogWrapper::glGetIntegerv(&_ret->super_CallLogWrapper,local_14,&local_18);
    err = glu::CallLogWrapper::glGetError(&_ret->super_CallLogWrapper);
    glu::checkError(err,"gl.glGetIntegerv(queryParam, &ret)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsLifetimeTests.cpp"
                    ,0x51);
    dVar1 = ::deGetFalse();
  } while (dVar1 != 0);
  ContextWrapper::log(_ret,__x);
  tcu::TestLog::operator<<(&local_198,this,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar2 = tcu::MessageBuilder::operator<<(&local_198,(char (*) [27])"// Single integer output: ");
  pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,&local_18);
  tcu::MessageBuilder::operator<<(pMVar2,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_198);
  return local_18;
}

Assistant:

GLint getInteger (ContextWrapper& gl, GLenum queryParam)
{
	GLint ret = 0;
	GLU_CHECK_CALL_ERROR(
		gl.glGetIntegerv(queryParam, &ret),
		gl.glGetError());
	gl.log() << TestLog::Message << "// Single integer output: " << ret << TestLog::EndMessage;
	return ret;
}